

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSC32.h
# Opt level: O0

int SetRudderThrusterSSC32(SSC32 *pSSC32,double angle,double urt)

{
  int iVar1;
  int local_1a0;
  int local_19c;
  int local_198;
  int local_194;
  int local_190;
  int local_18c;
  double local_188;
  double local_178;
  double local_168;
  double local_150;
  double local_148;
  double angletmp;
  int pws [32];
  int selectedchannels [32];
  double urt_local;
  double angle_local;
  SSC32 *pSSC32_local;
  
  memset(pws + 0x1e,0,0x80);
  memset(&angletmp,0,0x80);
  if (angle < 0.0) {
    if (ABS(pSSC32->MinAngle) <= ABS(pSSC32->MaxAngle)) {
      local_168 = pSSC32->MaxAngle;
    }
    else {
      local_168 = pSSC32->MinAngle;
    }
    local_168 = ABS(local_168);
    local_150 = pSSC32->MidAngle + (angle * (pSSC32->MidAngle - pSSC32->MinAngle)) / local_168;
  }
  else {
    if (ABS(pSSC32->MinAngle) <= ABS(pSSC32->MaxAngle)) {
      local_148 = pSSC32->MaxAngle;
    }
    else {
      local_148 = pSSC32->MinAngle;
    }
    local_148 = ABS(local_148);
    local_150 = pSSC32->MidAngle + (angle * (pSSC32->MaxAngle - pSSC32->MidAngle)) / local_148;
  }
  if (local_150 < 0.0) {
    if (ABS(pSSC32->MinAngle) <= ABS(pSSC32->MaxAngle)) {
      local_188 = pSSC32->MaxAngle;
    }
    else {
      local_188 = pSSC32->MinAngle;
    }
    local_188 = ABS(local_188);
    pws[(long)pSSC32->rudderchan + -2] = (int)((local_150 * 500.0) / local_188) + 0x5dc;
  }
  else {
    if (ABS(pSSC32->MinAngle) <= ABS(pSSC32->MaxAngle)) {
      local_178 = pSSC32->MaxAngle;
    }
    else {
      local_178 = pSSC32->MinAngle;
    }
    local_178 = ABS(local_178);
    pws[(long)pSSC32->rudderchan + -2] = (int)((local_150 * 500.0) / local_178) + 0x5dc;
  }
  pws[(long)pSSC32->rightthrusterchan + -2] = (int)((urt * 1000.0) / 2.0) + 0x5dc;
  if (pws[(long)pSSC32->rudderchan + -2] < 2000) {
    local_18c = pws[(long)pSSC32->rudderchan + -2];
  }
  else {
    local_18c = 2000;
  }
  if (local_18c < 0x3e9) {
    local_194 = 1000;
  }
  else {
    if (pws[(long)pSSC32->rudderchan + -2] < 2000) {
      local_190 = pws[(long)pSSC32->rudderchan + -2];
    }
    else {
      local_190 = 2000;
    }
    local_194 = local_190;
  }
  pws[(long)pSSC32->rudderchan + -2] = local_194;
  if (pws[(long)pSSC32->rightthrusterchan + -2] < 2000) {
    local_198 = pws[(long)pSSC32->rightthrusterchan + -2];
  }
  else {
    local_198 = 2000;
  }
  if (local_198 < 0x3e9) {
    local_1a0 = 1000;
  }
  else {
    if (pws[(long)pSSC32->rightthrusterchan + -2] < 2000) {
      local_19c = pws[(long)pSSC32->rightthrusterchan + -2];
    }
    else {
      local_19c = 2000;
    }
    local_1a0 = local_19c;
  }
  pws[(long)pSSC32->rightthrusterchan + -2] = local_1a0;
  pws[(long)pSSC32->rudderchan + 0x1e] = 1;
  pws[(long)pSSC32->rightthrusterchan + 0x1e] = 1;
  iVar1 = SetAllPWMsSSC32(pSSC32,pws + 0x1e,(int *)&angletmp);
  return iVar1;
}

Assistant:

inline int SetRudderThrusterSSC32(SSC32* pSSC32, double angle, double urt)
{
	int selectedchannels[NB_CHANNELS_PWM_SSC32];
	int pws[NB_CHANNELS_PWM_SSC32];
#ifndef DISABLE_RUDDER_MIDANGLE
	double angletmp = 0;
#endif // DISABLE_RUDDER_MIDANGLE

	memset(selectedchannels, 0, sizeof(selectedchannels));
	memset(pws, 0, sizeof(pws));

	// Convert angle (in rad) into SSC32 pulse width (in us).
#ifndef DISABLE_RUDDER_MIDANGLE
	angletmp = angle >= 0? pSSC32->MidAngle+angle*(pSSC32->MaxAngle-pSSC32->MidAngle)/max(fabs(pSSC32->MinAngle),fabs(pSSC32->MaxAngle)): pSSC32->MidAngle+angle*(pSSC32->MidAngle-pSSC32->MinAngle)/max(fabs(pSSC32->MinAngle),fabs(pSSC32->MaxAngle));
	//angletmp = angle >= 0? pSSC32->MidAngle+urudder*(pSSC32->MaxAngle-pSSC32->MidAngle): pSSC32->MidAngle+urudder*(pSSC32->MidAngle-pSSC32->MinAngle);
	if (angletmp >= 0)
		pws[pSSC32->rudderchan] = DEFAULT_MID_PW_SSC32+(int)(angletmp*(DEFAULT_MAX_PW_SSC32-DEFAULT_MID_PW_SSC32)
			/max(fabs(pSSC32->MinAngle),fabs(pSSC32->MaxAngle)));
	else
		pws[pSSC32->rudderchan] = DEFAULT_MID_PW_SSC32+(int)(angletmp*(DEFAULT_MID_PW_SSC32-DEFAULT_MIN_PW_SSC32)
			/max(fabs(pSSC32->MinAngle),fabs(pSSC32->MaxAngle)));
#else
	pws[pSSC32->rudderchan] = DEFAULT_MID_PW_SSC32+(int)(angle*(DEFAULT_MAX_PW_SSC32-DEFAULT_MIN_PW_SSC32)
		/(pSSC32->MaxAngle-pSSC32->MinAngle));
#endif // DISABLE_RUDDER_MIDANGLE
	// Convert u (in [-1;1]) into SSC32 pulse width (in us).
	pws[pSSC32->rightthrusterchan] = DEFAULT_MID_PW_SSC32+(int)(urt*(DEFAULT_MAX_PW_SSC32-DEFAULT_MIN_PW_SSC32)/2.0);

	pws[pSSC32->rudderchan] = max(min(pws[pSSC32->rudderchan], DEFAULT_MAX_PW_SSC32), DEFAULT_MIN_PW_SSC32);
	pws[pSSC32->rightthrusterchan] = max(min(pws[pSSC32->rightthrusterchan], DEFAULT_MAX_PW_SSC32), DEFAULT_MIN_PW_SSC32);

	selectedchannels[pSSC32->rudderchan] = 1;
	selectedchannels[pSSC32->rightthrusterchan] = 1;

	return SetAllPWMsSSC32(pSSC32, selectedchannels, pws);
}